

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

Page * page_merge_dirty(Page *pA,Page *pB)

{
  Page *local_88;
  Page *pTail;
  Page result;
  Page *pB_local;
  Page *pA_local;
  
  result.pDirtyNext = (Page *)0x0;
  local_88 = (Page *)&pTail;
  result.pPrevHot = pB;
  pB_local = pA;
  while (pB_local != (Page *)0x0 && result.pPrevHot != (Page *)0x0) {
    if (pB_local->pgno < (result.pPrevHot)->pgno) {
      local_88->pDirtyPrev = pB_local;
      pB_local->pDirtyNext = local_88;
      local_88 = pB_local;
      pB_local = pB_local->pDirtyPrev;
    }
    else {
      local_88->pDirtyPrev = result.pPrevHot;
      (result.pPrevHot)->pDirtyNext = local_88;
      local_88 = result.pPrevHot;
      result.pPrevHot = (result.pPrevHot)->pDirtyPrev;
    }
  }
  if (pB_local == (Page *)0x0) {
    if (result.pPrevHot == (Page *)0x0) {
      local_88->pDirtyNext = (Page *)0x0;
      local_88->pDirtyPrev = (Page *)0x0;
    }
    else {
      local_88->pDirtyPrev = result.pPrevHot;
      (result.pPrevHot)->pDirtyNext = local_88;
    }
  }
  else {
    local_88->pDirtyPrev = pB_local;
    pB_local->pDirtyNext = local_88;
  }
  return result.pDirtyNext;
}

Assistant:

static Page * page_merge_dirty(Page *pA, Page *pB)
{
	Page result, *pTail;
    /* Prevent compiler warning */
	result.pDirtyNext = result.pDirtyPrev = 0;
	pTail = &result;
	while( pA && pB ){
		if( pA->pgno < pB->pgno ){
			pTail->pDirtyPrev = pA;
			pA->pDirtyNext = pTail;
			pTail = pA;
			pA = pA->pDirtyPrev;
		}else{
			pTail->pDirtyPrev = pB;
			pB->pDirtyNext = pTail;
			pTail = pB;
			pB = pB->pDirtyPrev;
		}
	}
	if( pA ){
		pTail->pDirtyPrev = pA;
		pA->pDirtyNext = pTail;
	}else if( pB ){
		pTail->pDirtyPrev = pB;
		pB->pDirtyNext = pTail;
	}else{
		pTail->pDirtyPrev = pTail->pDirtyNext = 0;
	}
	return result.pDirtyPrev;
}